

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtools.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* stringtools::split_with_delims
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,
            set<char,_std::less<char>,_std::allocator<char>_> *delims)

{
  ulong uVar1;
  size_t sVar2;
  size_t __pos;
  set<char,_std::less<char>,_std::allocator<char>_> *psVar3;
  bool bVar4;
  size_type sVar5;
  const_reference __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_38;
  size_t pos;
  size_t prev;
  set<char,_std::less<char>,_std::allocator<char>_> *local_20;
  set<char,_std::less<char>,_std::allocator<char>_> *delims_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  
  prev._7_1_ = 0;
  local_20 = delims;
  delims_local = (set<char,_std::less<char>,_std::allocator<char>_> *)str;
  str_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  pos = 0;
  for (local_38 = 0; uVar1 = local_38,
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     delims_local), psVar3 = local_20, sVar2 = pos, uVar1 < sVar5;
      local_38 = local_38 + 1) {
    __x = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     delims_local,local_38);
    bVar4 = std::set<char,_std::less<char>,_std::allocator<char>_>::contains(psVar3,__x);
    if (bVar4) {
      if (local_38 != pos) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)delims_local
                   ,pos,local_38 - pos);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)delims_local,
                 local_38,1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      pos = local_38 + 1;
    }
  }
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     delims_local);
  psVar3 = delims_local;
  __pos = pos;
  if (sVar2 < sVar5) {
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       delims_local);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3
               ,__pos,sVar5 - pos);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_with_delims(const std::string& str, const std::set<char>& delims)
    {
        std::vector<std::string> tokens;
        size_t prev = 0;
        for(size_t pos = 0 ; pos < str.length() ; ++pos)
        {
            if(!delims.contains(str[pos]))
                continue;

            if(pos-prev > 0)
                tokens.emplace_back(str.substr(prev, pos-prev));
            tokens.emplace_back(str.substr(pos, 1));
            prev = pos + 1;
        }

        if(prev < str.length())
            tokens.emplace_back(str.substr(prev, str.length()-prev));

        return tokens;
    }